

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O2

int amqp_tcp_socket_close(void *base,amqp_socket_close_enum force)

{
  int iVar1;
  
  if (*(int *)((long)base + 8) == -1) {
    iVar1 = -0x11;
  }
  else {
    iVar1 = amqp_os_socket_close(*(int *)((long)base + 8));
    if (iVar1 == 0) {
      *(undefined4 *)((long)base + 8) = 0xffffffff;
      iVar1 = 0;
    }
    else {
      iVar1 = -9;
    }
  }
  return iVar1;
}

Assistant:

static int amqp_tcp_socket_close(void *base,
                                 AMQP_UNUSED amqp_socket_close_enum force) {
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  if (-1 == self->sockfd) {
    return AMQP_STATUS_SOCKET_CLOSED;
  }

  if (amqp_os_socket_close(self->sockfd)) {
    return AMQP_STATUS_SOCKET_ERROR;
  }
  self->sockfd = -1;

  return AMQP_STATUS_OK;
}